

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O2

LLVMPointsToSet __thiscall
dg::DGLLVMPointerAnalysis::getLLVMPointsTo(DGLLVMPointerAnalysis *this,Value *val)

{
  PSNode *pPVar1;
  DGLLVMPointsToSet *this_00;
  Value *in_RDX;
  
  pPVar1 = getPointsToNode((DGLLVMPointerAnalysis *)val,in_RDX);
  if ((pPVar1 == (PSNode *)0x0) || (*(long *)(pPVar1 + 200) == 0)) {
    this_00 = (DGLLVMPointsToSet *)operator_new(0x30);
    pPVar1 = (PSNode *)getUnknownPTSet();
  }
  else {
    pPVar1 = pPVar1 + 0xb0;
    this_00 = (DGLLVMPointsToSet *)operator_new(0x30);
  }
  DGLLVMPointsToSet::DGLLVMPointsToSet(this_00,(PointsToSetT *)pPVar1);
  (this->super_LLVMPointerAnalysis)._vptr_LLVMPointerAnalysis = (_func_int **)this_00;
  return (unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>)
         (unique_ptr<dg::LLVMPointsToSetImpl,_std::default_delete<dg::LLVMPointsToSetImpl>_>)this;
}

Assistant:

LLVMPointsToSet getLLVMPointsTo(const llvm::Value *val) override {
        DGLLVMPointsToSet *pts;
        if (auto *node = getPointsToNode(val)) {
            if (node->pointsTo.empty()) {
                pts = new DGLLVMPointsToSet(getUnknownPTSet());
            } else {
                pts = new DGLLVMPointsToSet(node->pointsTo);
            }
        } else {
            pts = new DGLLVMPointsToSet(getUnknownPTSet());
        }
        return pts->toLLVMPointsToSet();
    }